

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitStringDefinitions_measurementDuplicates_Test::~unitStringDefinitions_measurementDuplicates_Test
          (unitStringDefinitions_measurementDuplicates_Test *this)

{
  unitStringDefinitions_measurementDuplicates_Test *this_local;
  
  ~unitStringDefinitions_measurementDuplicates_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, measurementDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_measurement_types) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second)
            << "duplicate measurement type string " << ustring.first;
    }
}